

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half.cpp
# Opt level: O3

void printBits(ostream *os,half h)

{
  int i;
  uint uVar1;
  bool bVar2;
  byte local_2a [2];
  
  uVar1 = 0xf;
  do {
    local_2a[0] = (h._h >> (uVar1 & 0x1f) & 1) == 0 ^ 0x31;
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_2a,1);
    if ((uVar1 == 0xf) || (uVar1 == 10)) {
      local_2a[1] = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)(local_2a + 1),1);
    }
    bVar2 = uVar1 != 0;
    uVar1 = uVar1 - 1;
  } while (bVar2);
  return;
}

Assistant:

IMATH_EXPORT void
printBits (ostream& os, half h)
{
    unsigned short b = h.bits ();

    for (int i = 15; i >= 0; i--)
    {
        os << (((b >> i) & 1) ? '1' : '0');

        if (i == 15 || i == 10) os << ' ';
    }
}